

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformdialoghelper.cpp
# Opt level: O2

void __thiscall QMessageDialogOptions::removeButton(QMessageDialogOptions *this,int id)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_68;
  CustomButton local_48;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.d = (Data *)0x0;
  local_68.ptr = (char16_t *)0x0;
  local_68.size = 0;
  local_48.label.d.size = 0;
  local_48.label.d.d = (Data *)0x0;
  local_48.label.d.ptr = (char16_t *)0x0;
  local_48.role = EOL;
  local_48.button = (void *)0x0;
  local_48.id = id;
  QtPrivate::
  sequential_erase_one<QList<QMessageDialogOptions::CustomButton>,QMessageDialogOptions::CustomButton>
            ((QList<QMessageDialogOptions::CustomButton> *)(*(long *)this + 0x70),&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMessageDialogOptions::removeButton(int id)
{
    d->customButtons.removeOne(CustomButton(id));
}